

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O2

int xar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  uint64_t remaining;
  size_t used;
  
  used = 0;
  plVar2 = (long *)a->format->data;
  if (plVar2[0x3d] != 0) {
    __archive_read_consume(a,plVar2[0x3d]);
    plVar2[0x3d] = 0;
  }
  iVar3 = 1;
  if (((int)plVar2[3] == 0) && (remaining = plVar2[0x3c], remaining != 0)) {
    if ((int)plVar2[0x3a] != 0) {
      iVar3 = rd_contents_init(a,*(enctype *)(plVar2 + 0x3f),(int)plVar2[0x40],(int)plVar2[0x45]);
      if (iVar3 != 0) {
        plVar2[0x3c] = 0;
        return iVar3;
      }
      *(undefined4 *)(plVar2 + 0x3a) = 0;
      remaining = plVar2[0x3c];
    }
    *buff = (void *)0x0;
    iVar3 = rd_contents(a,buff,size,&used,remaining);
    if (iVar3 == 0) {
      lVar4 = plVar2[0x3b];
      *offset = lVar4;
      lVar4 = lVar4 + *size;
      plVar2[0x3b] = lVar4;
      plVar2[1] = plVar2[1] + *size;
      *plVar2 = *plVar2 + used;
      plVar1 = plVar2 + 0x3c;
      *plVar1 = *plVar1 - used;
      plVar2[0x3d] = used;
      if (*plVar1 != 0) {
        return 0;
      }
      if (lVar4 == plVar2[0x3e]) {
        iVar3 = checksum_final(a,plVar2 + 0x42,plVar2[0x41],plVar2 + 0x47,plVar2[0x46]);
        if (iVar3 == 0) {
          return 0;
        }
      }
      else {
        archive_set_error(&a->archive,-1,"Decompressed size error");
        iVar3 = -0x1e;
      }
    }
  }
  *buff = (void *)0x0;
  *size = 0;
  *offset = plVar2[1];
  return iVar3;
}

Assistant:

static int
xar_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct xar *xar;
	size_t used = 0;
	int r;

	xar = (struct xar *)(a->format->data);

	if (xar->entry_unconsumed) {
		__archive_read_consume(a, xar->entry_unconsumed);
		xar->entry_unconsumed = 0;
	}

	if (xar->end_of_file || xar->entry_remaining <= 0) {
		r = ARCHIVE_EOF;
		goto abort_read_data;
	}

	if (xar->entry_init) {
		r = rd_contents_init(a, xar->entry_encoding,
		    xar->entry_a_sum.alg, xar->entry_e_sum.alg);
		if (r != ARCHIVE_OK) {
			xar->entry_remaining = 0;
			return (r);
		}
		xar->entry_init = 0;
	}

	*buff = NULL;
	r = rd_contents(a, buff, size, &used, xar->entry_remaining);
	if (r != ARCHIVE_OK)
		goto abort_read_data;

	*offset = xar->entry_total;
	xar->entry_total += *size;
	xar->total += *size;
	xar->offset += used;
	xar->entry_remaining -= used;
	xar->entry_unconsumed = used;

	if (xar->entry_remaining == 0) {
		if (xar->entry_total != xar->entry_size) {
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Decompressed size error");
			r = ARCHIVE_FATAL;
			goto abort_read_data;
		}
		r = checksum_final(a,
		    xar->entry_a_sum.val, xar->entry_a_sum.len,
		    xar->entry_e_sum.val, xar->entry_e_sum.len);
		if (r != ARCHIVE_OK)
			goto abort_read_data;
	}

	return (ARCHIVE_OK);
abort_read_data:
	*buff = NULL;
	*size = 0;
	*offset = xar->total;
	return (r);
}